

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNStmStaticPropInit::gen_code(CTPNStmStaticPropInit *this,int param_1,int param_2)

{
  int iVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcGenTarg *pCVar4;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  iVar1 = G_cg->sp_depth_;
  pCVar3 = (this->super_CTPNStmStaticPropInitBase).expr_;
  (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
  pCVar4 = G_cg;
  if (G_cg->sp_depth_ <= iVar1) {
    CTcGenTarg::write_op(G_cg,'\b');
    pCVar4 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar4->max_sp_depth_ <= iVar2) {
      pCVar4->max_sp_depth_ = iVar1;
    }
  }
  CTcGenTarg::write_op(pCVar4,0x88);
  pCVar4 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar4->max_sp_depth_ <= iVar2) {
    pCVar4->max_sp_depth_ = iVar1;
  }
  CTcGenTarg::write_op(pCVar4,0xe7);
  CTcDataStream::write_prop_id
            (&G_cs->super_CTcDataStream,(uint)(this->super_CTPNStmStaticPropInitBase).prop_);
  pCVar4 = G_cg;
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  CTcGenTarg::write_op(pCVar4,'P');
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  return;
}

Assistant:

void CTPNStmStaticPropInit::gen_code(int, int)
{
    int depth;
    
    /* add a line record */
    add_debug_line_rec();

    /* note the initial stack depth */
    depth = G_cg->get_sp_depth();

    /* generate the expression, keeping the generated value */
    expr_->gen_code(FALSE, FALSE);

    /* ensure that we generated a value; if we didn't, push nil by default */
    if (G_cg->get_sp_depth() <= depth)
    {
        /* push a default nil value */
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->note_push();
    }

    /* 
     *   duplicate the value on the stack, so we can assign it to
     *   initialize the property and also return it 
     */
    G_cg->write_op(OPC_DUP);
    G_cg->note_push();

    /* write the SETPROPSELF to initialize the property */
    G_cg->write_op(OPC_SETPROPSELF);
    G_cs->write_prop_id(prop_);

    /* SETPROPSELF removes the value */
    G_cg->note_pop();

    /* return the value (which we duplicated on the stack) */
    G_cg->write_op(OPC_RETVAL);

    /* RETVAL removes the value */
    G_cg->note_pop();
}